

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_atxheader_line(MD_CTX *ctx,MD_OFFSET beg,MD_OFFSET *p_beg,MD_OFFSET *p_end,uint *p_level)

{
  bool bVar1;
  MD_OFFSET off;
  int n;
  uint *p_level_local;
  MD_OFFSET *p_end_local;
  MD_OFFSET *p_beg_local;
  MD_OFFSET beg_local;
  MD_CTX *ctx_local;
  int local_4;
  
  off = beg + 1;
  while( true ) {
    bVar1 = false;
    if ((off < ctx->size) && (bVar1 = false, ctx->text[off] == '#')) {
      bVar1 = off - beg < 7;
    }
    if (!bVar1) break;
    off = off + 1;
  }
  if ((int)(off - beg) < 7) {
    *p_level = off - beg;
    if ((((((ctx->parser).flags & 2) == 0) && (off < ctx->size)) && (ctx->text[off] != ' ')) &&
       (((ctx->text[off] != '\t' && (ctx->text[off] != '\r')) && (ctx->text[off] != '\n')))) {
      local_4 = 0;
    }
    else {
      while( true ) {
        bVar1 = false;
        if (off < ctx->size) {
          bVar1 = ctx->text[off] == ' ';
        }
        if (!bVar1) break;
        off = off + 1;
      }
      *p_beg = off;
      *p_end = off;
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
md_is_atxheader_line(MD_CTX* ctx, OFF beg, OFF* p_beg, OFF* p_end, unsigned* p_level)
{
    int n;
    OFF off = beg + 1;

    while(off < ctx->size  &&  CH(off) == _T('#')  &&  off - beg < 7)
        off++;
    n = off - beg;

    if(n > 6)
        return FALSE;
    *p_level = n;

    if(!(ctx->parser.flags & MD_FLAG_PERMISSIVEATXHEADERS)  &&  off < ctx->size  &&
       CH(off) != _T(' ')  &&  CH(off) != _T('\t')  &&  !ISNEWLINE(off))
        return FALSE;

    while(off < ctx->size  &&  CH(off) == _T(' '))
        off++;
    *p_beg = off;
    *p_end = off;
    return TRUE;
}